

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

void __thiscall pbrt::RGBSpectrum::RGBSpectrum(RGBSpectrum *this,RGBColorSpace *cs,RGB *rgb)

{
  undefined8 uVar1;
  initializer_list<float> __l;
  float *in_RDX;
  long in_RSI;
  iterator in_RDI;
  float fVar2;
  undefined1 auVar5 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  RGB RVar6;
  RGBSigmoidPolynomial RVar7;
  Float m;
  size_type in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  Float a;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  RGB local_54 [2];
  float local_3c;
  float fVar8;
  float fVar9;
  RGBColorSpace *this_00;
  
  a = (Float)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  *(undefined8 *)in_RDI = *(undefined8 *)in_RDX;
  in_RDI[2] = in_RDX[2];
  *(long *)(in_RDI + 8) = in_RSI + 0x20;
  local_3c = *in_RDX;
  fVar8 = in_RDX[1];
  fVar9 = in_RDX[2];
  this_00 = (RGBColorSpace *)&stack0xffffffffffffffc4;
  __l._M_len = in_stack_ffffffffffffff80;
  __l._M_array = in_RDI;
  fVar2 = std::max<float>(__l);
  in_RDI[3] = fVar2 * 2.0;
  if ((in_RDI[3] != 0.0) || (NAN(in_RDI[3]))) {
    auVar5 = (undefined1  [56])0x0;
    RVar6 = RGB::operator/((RGB *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),a);
    local_54[0].b = RVar6.b;
    auVar3._0_8_ = RVar6._0_8_;
    auVar3._8_56_ = auVar5;
    local_54[0]._0_8_ = vmovlpd_avx(auVar3._0_16_);
  }
  else {
    auVar5 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    RGB::RGB(local_54,0.0,0.0,0.0);
  }
  RVar7 = RGBColorSpace::ToRGBCoeffs(this_00,(RGB *)CONCAT44(fVar9,fVar8));
  auVar4._0_8_ = RVar7._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  *(undefined8 *)(in_RDI + 4) = uVar1;
  in_RDI[6] = RVar7.c2;
  return;
}

Assistant:

RGBSpectrum::RGBSpectrum(const RGBColorSpace &cs, const RGB &rgb)
    : rgb(rgb), illuminant(&cs.illuminant) {
    Float m = std::max({rgb.r, rgb.g, rgb.b});
    scale = 2 * m;
    rsp = cs.ToRGBCoeffs(scale ? rgb / scale : RGB(0, 0, 0));
}